

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

time_t fs_get_modtime(string_view path)

{
  string_view path_00;
  int iVar1;
  const_pointer pvVar2;
  int *piVar3;
  string_view local_1d8;
  size_t local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  stat s;
  statx sx;
  undefined1 auStack_20 [4];
  int r;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  iVar1 = statx(0xffffff9c,pvVar2,0x800,0x40,s.__glibc_reserved + 2);
  if (iVar1 == 0) {
    path_local._M_str = (char *)sx.stx_ctime._8_8_;
  }
  else {
    if ((iVar1 == 0) || (piVar3 = __errno_location(), *piVar3 == 0x26)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      iVar1 = stat(pvVar2,(stat *)local_1b8);
      if (iVar1 == 0) {
        return s.st_atim.tv_nsec;
      }
    }
    local_1c8 = _auStack_20;
    local_1c0 = (char *)path_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"fs_get_modtime");
    path_00._M_str = local_1c0;
    path_00._M_len = local_1c8;
    fs_print_error(path_00,local_1d8);
    path_local._M_str = (char *)0x0;
  }
  return (time_t)path_local._M_str;
}

Assistant:

std::time_t fs_get_modtime(std::string_view path)
{

#if defined(HAVE_CLOCK_CAST) && defined(HAVE_CXX_FILESYSTEM)
  if(const auto &t_fs = fs_get_modtime_fs(path); t_fs){
    const auto t_sys = std::chrono::clock_cast<std::chrono::system_clock>(t_fs.value());
    return std::chrono::system_clock::to_time_t(t_sys);
  }
#else

  int r = 0;

#if defined(STATX_MTIME) && defined(USE_STATX)
// https://www.man7.org/linux/man-pages/man2/statx.2.html
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_MTIME, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_mtime.tv_sec;
#endif
  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_mtime;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}